

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LineBlocker.cpp
# Opt level: O3

void __thiscall
tiger::trains::ai::LineBlocker::changeCurrentBlock
          (LineBlocker *this,
          vector<const_tiger::trains::world::Point_*,_std::allocator<const_tiger::trains::world::Point_*>_>
          *points)

{
  pointer ppVar1;
  _Rb_tree<std::pair<int,_tiger::trains::ai::LineBlock>,_std::pair<int,_tiger::trains::ai::LineBlock>,_std::_Identity<std::pair<int,_tiger::trains::ai::LineBlock>_>,_std::less<std::pair<int,_tiger::trains::ai::LineBlock>_>,_std::allocator<std::pair<int,_tiger::trains::ai::LineBlock>_>_>
  *this_00;
  pointer ppLVar2;
  Line *this_01;
  iterator iVar3;
  bool bVar4;
  int iVar5;
  Player *this_02;
  vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_> *pvVar6;
  Point *pPVar7;
  Point *pPVar8;
  pointer ppLVar9;
  pointer ppVar10;
  pair<std::_Rb_tree_iterator<std::pair<int,_tiger::trains::ai::LineBlock>_>,_std::_Rb_tree_iterator<std::pair<int,_tiger::trains::ai::LineBlock>_>_>
  pVar11;
  pair<int,_tiger::trains::ai::LineBlock> block;
  key_type local_48;
  
  ppVar10 = (this->currentBlock).
            super__Vector_base<std::pair<int,_tiger::trains::ai::LineBlock>,_std::allocator<std::pair<int,_tiger::trains::ai::LineBlock>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (this->currentBlock).
           super__Vector_base<std::pair<int,_tiger::trains::ai::LineBlock>,_std::allocator<std::pair<int,_tiger::trains::ai::LineBlock>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar10 != ppVar1) {
    do {
      local_48.second.inPoint = (ppVar10->second).inPoint;
      local_48.first = ppVar10->first;
      local_48._4_4_ = *(undefined4 *)&ppVar10->field_0x4;
      local_48.second.line = (ppVar10->second).line;
      this_00 = &this->blockLines->_M_t;
      pVar11 = std::
               _Rb_tree<std::pair<int,_tiger::trains::ai::LineBlock>,_std::pair<int,_tiger::trains::ai::LineBlock>,_std::_Identity<std::pair<int,_tiger::trains::ai::LineBlock>_>,_std::less<std::pair<int,_tiger::trains::ai::LineBlock>_>,_std::allocator<std::pair<int,_tiger::trains::ai::LineBlock>_>_>
               ::equal_range(this_00,&local_48);
      std::
      _Rb_tree<std::pair<int,_tiger::trains::ai::LineBlock>,_std::pair<int,_tiger::trains::ai::LineBlock>,_std::_Identity<std::pair<int,_tiger::trains::ai::LineBlock>_>,_std::less<std::pair<int,_tiger::trains::ai::LineBlock>_>,_std::allocator<std::pair<int,_tiger::trains::ai::LineBlock>_>_>
      ::_M_erase_aux(this_00,(_Base_ptr)pVar11.first._M_node,(_Base_ptr)pVar11.second._M_node);
      ppVar10 = ppVar10 + 1;
    } while (ppVar10 != ppVar1);
    ppVar10 = (this->currentBlock).
              super__Vector_base<std::pair<int,_tiger::trains::ai::LineBlock>,_std::allocator<std::pair<int,_tiger::trains::ai::LineBlock>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((this->currentBlock).
        super__Vector_base<std::pair<int,_tiger::trains::ai::LineBlock>,_std::allocator<std::pair<int,_tiger::trains::ai::LineBlock>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != ppVar10) {
      (this->currentBlock).
      super__Vector_base<std::pair<int,_tiger::trains::ai::LineBlock>,_std::allocator<std::pair<int,_tiger::trains::ai::LineBlock>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = ppVar10;
    }
  }
  this_02 = world::Train::getPlayer(this->train);
  world::Player::getHome(this_02);
  pvVar6 = world::Point::getEdges
                     ((points->
                      super__Vector_base<const_tiger::trains::world::Point_*,_std::allocator<const_tiger::trains::world::Point_*>_>
                      )._M_impl.super__Vector_impl_data._M_start[1]);
  ppLVar9 = (pvVar6->
            super__Vector_base<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  ppLVar2 = (pvVar6->
            super__Vector_base<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if (ppLVar9 != ppLVar2) {
    do {
      this_01 = *ppLVar9;
      pPVar7 = world::Line::getAnotherPoint
                         (this_01,(points->
                                  super__Vector_base<const_tiger::trains::world::Point_*,_std::allocator<const_tiger::trains::world::Point_*>_>
                                  )._M_impl.super__Vector_impl_data._M_start[1]);
      pPVar8 = *(points->
                super__Vector_base<const_tiger::trains::world::Point_*,_std::allocator<const_tiger::trains::world::Point_*>_>
                )._M_impl.super__Vector_impl_data._M_start;
      if ((pPVar7 == pPVar8) &&
         (bVar4 = BotSharedData::doMove(this->sharedData,pPVar8,this_01), bVar4)) {
        iVar5 = world::Train::getIdx(this->train);
        local_48.second.inPoint =
             (points->
             super__Vector_base<const_tiger::trains::world::Point_*,_std::allocator<const_tiger::trains::world::Point_*>_>
             )._M_impl.super__Vector_impl_data._M_start[1];
        local_48.first = iVar5;
        iVar3._M_current =
             (this->currentBlock).
             super__Vector_base<std::pair<int,_tiger::trains::ai::LineBlock>,_std::allocator<std::pair<int,_tiger::trains::ai::LineBlock>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (this->currentBlock).
            super__Vector_base<std::pair<int,_tiger::trains::ai::LineBlock>,_std::allocator<std::pair<int,_tiger::trains::ai::LineBlock>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          local_48.second.line = this_01;
          std::
          vector<std::pair<int,tiger::trains::ai::LineBlock>,std::allocator<std::pair<int,tiger::trains::ai::LineBlock>>>
          ::_M_realloc_insert<std::pair<int,tiger::trains::ai::LineBlock>>
                    ((vector<std::pair<int,tiger::trains::ai::LineBlock>,std::allocator<std::pair<int,tiger::trains::ai::LineBlock>>>
                      *)&this->currentBlock,iVar3,&local_48);
          ppVar10 = (this->currentBlock).
                    super__Vector_base<std::pair<int,_tiger::trains::ai::LineBlock>,_std::allocator<std::pair<int,_tiger::trains::ai::LineBlock>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        }
        else {
          ((iVar3._M_current)->second).inPoint = local_48.second.inPoint;
          (iVar3._M_current)->first = iVar5;
          *(undefined4 *)&(iVar3._M_current)->field_0x4 = local_48._4_4_;
          ((iVar3._M_current)->second).line = this_01;
          ppVar10 = (this->currentBlock).
                    super__Vector_base<std::pair<int,_tiger::trains::ai::LineBlock>,_std::allocator<std::pair<int,_tiger::trains::ai::LineBlock>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish + 1;
          (this->currentBlock).
          super__Vector_base<std::pair<int,_tiger::trains::ai::LineBlock>,_std::allocator<std::pair<int,_tiger::trains::ai::LineBlock>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = ppVar10;
          local_48.second.line = this_01;
        }
        std::
        _Rb_tree<std::pair<int,tiger::trains::ai::LineBlock>,std::pair<int,tiger::trains::ai::LineBlock>,std::_Identity<std::pair<int,tiger::trains::ai::LineBlock>>,std::less<std::pair<int,tiger::trains::ai::LineBlock>>,std::allocator<std::pair<int,tiger::trains::ai::LineBlock>>>
        ::_M_insert_unique<std::pair<int,tiger::trains::ai::LineBlock>const&>
                  ((_Rb_tree<std::pair<int,tiger::trains::ai::LineBlock>,std::pair<int,tiger::trains::ai::LineBlock>,std::_Identity<std::pair<int,tiger::trains::ai::LineBlock>>,std::less<std::pair<int,tiger::trains::ai::LineBlock>>,std::allocator<std::pair<int,tiger::trains::ai::LineBlock>>>
                    *)this->blockLines,ppVar10 + -1);
      }
      pPVar8 = world::Line::getAnotherPoint
                         (this_01,(points->
                                  super__Vector_base<const_tiger::trains::world::Point_*,_std::allocator<const_tiger::trains::world::Point_*>_>
                                  )._M_impl.super__Vector_impl_data._M_start[1]);
      if (pPVar8 == (points->
                    super__Vector_base<const_tiger::trains::world::Point_*,_std::allocator<const_tiger::trains::world::Point_*>_>
                    )._M_impl.super__Vector_impl_data._M_start[2]) {
        iVar5 = world::Train::getIdx(this->train);
        local_48.second.inPoint =
             *(points->
              super__Vector_base<const_tiger::trains::world::Point_*,_std::allocator<const_tiger::trains::world::Point_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
        local_48.first = iVar5;
        iVar3._M_current =
             (this->currentBlock).
             super__Vector_base<std::pair<int,_tiger::trains::ai::LineBlock>,_std::allocator<std::pair<int,_tiger::trains::ai::LineBlock>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (this->currentBlock).
            super__Vector_base<std::pair<int,_tiger::trains::ai::LineBlock>,_std::allocator<std::pair<int,_tiger::trains::ai::LineBlock>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          local_48.second.line = this_01;
          std::
          vector<std::pair<int,tiger::trains::ai::LineBlock>,std::allocator<std::pair<int,tiger::trains::ai::LineBlock>>>
          ::_M_realloc_insert<std::pair<int,tiger::trains::ai::LineBlock>>
                    ((vector<std::pair<int,tiger::trains::ai::LineBlock>,std::allocator<std::pair<int,tiger::trains::ai::LineBlock>>>
                      *)&this->currentBlock,iVar3,&local_48);
          ppVar10 = (this->currentBlock).
                    super__Vector_base<std::pair<int,_tiger::trains::ai::LineBlock>,_std::allocator<std::pair<int,_tiger::trains::ai::LineBlock>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        }
        else {
          ((iVar3._M_current)->second).inPoint = local_48.second.inPoint;
          (iVar3._M_current)->first = iVar5;
          *(undefined4 *)&(iVar3._M_current)->field_0x4 = local_48._4_4_;
          ((iVar3._M_current)->second).line = this_01;
          ppVar10 = (this->currentBlock).
                    super__Vector_base<std::pair<int,_tiger::trains::ai::LineBlock>,_std::allocator<std::pair<int,_tiger::trains::ai::LineBlock>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish + 1;
          (this->currentBlock).
          super__Vector_base<std::pair<int,_tiger::trains::ai::LineBlock>,_std::allocator<std::pair<int,_tiger::trains::ai::LineBlock>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = ppVar10;
          local_48.second.line = this_01;
        }
        std::
        _Rb_tree<std::pair<int,tiger::trains::ai::LineBlock>,std::pair<int,tiger::trains::ai::LineBlock>,std::_Identity<std::pair<int,tiger::trains::ai::LineBlock>>,std::less<std::pair<int,tiger::trains::ai::LineBlock>>,std::allocator<std::pair<int,tiger::trains::ai::LineBlock>>>
        ::_M_insert_unique<std::pair<int,tiger::trains::ai::LineBlock>const&>
                  ((_Rb_tree<std::pair<int,tiger::trains::ai::LineBlock>,std::pair<int,tiger::trains::ai::LineBlock>,std::_Identity<std::pair<int,tiger::trains::ai::LineBlock>>,std::less<std::pair<int,tiger::trains::ai::LineBlock>>,std::allocator<std::pair<int,tiger::trains::ai::LineBlock>>>
                    *)this->blockLines,ppVar10 + -1);
      }
      ppLVar9 = ppLVar9 + 1;
    } while (ppLVar9 != ppLVar2);
  }
  return;
}

Assistant:

void LineBlocker::changeCurrentBlock(const std::vector<const world::Point *> &points)
{
    for (auto block : currentBlock)
    {
        blockLines->erase(block);
    }

    currentBlock.clear();

    const world::Town *homeTown = (world::Town *)train->getPlayer()->getHome();


    for (auto line : points[1]->getEdges())
    {

        if (line->getAnotherPoint(points[1]) == points[0])
        {
            if (sharedData->doMove(points[0], line))
            {
                currentBlock.push_back({train->getIdx(), {line, points[1]} });
                blockLines->insert(currentBlock.back());
            }
        }

        if (line->getAnotherPoint(points[1]) == points[2])
        {
            currentBlock.push_back({train->getIdx(), {line, points[0]} });
            blockLines->insert(currentBlock.back());
        }

        /* if (line->getAnotherPoint(points[1]) != points[2] &&
                 line->getAnotherPoint(points[1]) != points[0] &&
                 points[1] != homeTown->getPoint())
         {
             currentBlock.push_back({train->getIdx(), {line, line->getAnotherPoint(points[1])} });
             blockLines->insert(currentBlock.back());
         }*/

    }


}